

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

PClassActor * ClassForSpawn(FName *classname)

{
  bool bVar1;
  PClassActor *this;
  FName local_14;
  
  this = (PClassActor *)PClass::FindClass(&local_14);
  if (this == (PClassActor *)0x0) {
    I_Error("Attempt to spawn actor of unknown type \'%s\'\n",
            FName::NameData.NameArray[classname->Index].Text);
  }
  bVar1 = DObject::IsKindOf((DObject *)this,PClassActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    I_Error("Attempt to spawn non-actor of type \'%s\'\n",
            FName::NameData.NameArray[classname->Index].Text);
  }
  return this;
}

Assistant:

PClassActor *ClassForSpawn(FName classname)
{
	PClass *cls = PClass::FindClass(classname);
	if (cls == NULL)
	{
		I_Error("Attempt to spawn actor of unknown type '%s'\n", classname.GetChars());
	}
	if (!cls->IsKindOf(RUNTIME_CLASS(PClassActor)))
	{
		I_Error("Attempt to spawn non-actor of type '%s'\n", classname.GetChars());
	}
	return static_cast<PClassActor*>(cls);
}